

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void * __thiscall LLVMBC::LLVMContext::allocate(LLVMContext *this,size_t size,size_t align)

{
  void *pvVar1;
  
  pvVar1 = allocate_from_chain(this,size,align);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  allocate_new_chain(this,size,align);
  pvVar1 = allocate_from_chain(this,size,align);
  return pvVar1;
}

Assistant:

void *LLVMContext::allocate(size_t size, size_t align)
{
	void *ptr = allocate_from_chain(size, align);
	if (!ptr)
	{
		allocate_new_chain(size, align);
		ptr = allocate_from_chain(size, align);
	}
	return ptr;
}